

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_registry.hxx
# Opt level: O2

void cryptox::test::test_vector_registry<cryptox::message_digest_algorithm<&EVP_md5,_128UL>_>::
     test_all_vectors(void)

{
  test_vector_map_type *ptVar1;
  _Base_ptr p_Var2;
  
  ptVar1 = test_vector_registry<cryptox::message_digest_algorithm<&EVP_md5,128ul>>::
           test_vectors_abi_cxx11_();
  for (p_Var2 = (ptVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(ptVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    test_vector((string *)(p_Var2 + 1),(string *)(p_Var2 + 2));
  }
  return;
}

Assistant:

static void test_all_vectors() {
			// TODO: Have a warning on untested algorithms.

			typedef test_vector_map_type::value_type pair_type;
			BOOST_FOREACH(pair_type& pair, test_vectors()) {
				test_vector(pair.first, pair.second);
			}
		}